

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint negotiate_1284(uchar mode)

{
  uint uVar1;
  uchar mode_local;
  
  outb((bool)mode,(unsigned_short)ZvgIO.ecpData);
  outb((bool)mode,(unsigned_short)ZvgIO.ecpData);
  outb((bool)mode,(unsigned_short)ZvgIO.ecpData);
  outb((bool)mode,(unsigned_short)ZvgIO.ecpData);
  scdcr('\b','\x02');
  uVar1 = waitForDsrEQ('x','8',100);
  if (uVar1 != 0xffffffff) {
    cdcr('\x01');
    outb((bool)ZvgIO.ecpDcrState,(unsigned_short)ZvgIO.ecpDcr);
    outb((bool)ZvgIO.ecpDcrState,(unsigned_short)ZvgIO.ecpDcr);
    outb((bool)ZvgIO.ecpDcrState,(unsigned_short)ZvgIO.ecpDcr);
    sdcr('\x03');
    uVar1 = waitForDsrNE('@','\0',100);
    if (uVar1 != 0xffffffff) {
      return 0;
    }
  }
  compatibility();
  return 0x12;
}

Assistant:

static uint negotiate_1284( uchar mode)
{
	// Setup a negotiation request, setup for at least 1us

	outportb( ZvgIO.ecpData, mode);					// setup data lines
	outportb( ZvgIO.ecpData, mode);
	outportb( ZvgIO.ecpData, mode);
	outportb( ZvgIO.ecpData, mode);

	// Set 1284_Active high and HostBusy low

	scdcr( DCR_1284_Active, DCR_HostBusy);

	// look for awhile and see if the peripheral will respond

	if (waitForDsrEQ( DSR_AckDataReq|DSR_PtrClk|DSR_nDataAvail|DSR_XFlag,
			DSR_AckDataReq|DSR_nDataAvail|DSR_XFlag, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
		goto WaitTimeout;

	// set HostClk low for 1us

	cdcr( DCR_HostClk);
	outportb( ZvgIO.ecpDcr, ZvgIO.ecpDcrState);
	outportb( ZvgIO.ecpDcr, ZvgIO.ecpDcrState);
	outportb( ZvgIO.ecpDcr, ZvgIO.ecpDcrState);

	// finish pulse and set HostBusy high

	sdcr( DCR_HostClk | DCR_HostBusy);

	// wait for peripheral to respond

	if (waitForDsrNE( DSR_PtrClk, 0, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
		goto WaitTimeout;

	// negotiations successful, return

	return (errOk);

WaitTimeout:
	compatibility();
	return (errEcpFailed);		// timeout is not an error, just a non-1284 device
}